

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

ngx_int_t ngx_filename_cmp(u_char *s1,u_char *s2,size_t n)

{
  ulong local_48;
  ulong local_40;
  ngx_uint_t c2;
  ngx_uint_t c1;
  size_t n_local;
  u_char *s2_local;
  u_char *s1_local;
  
  c1 = n;
  n_local = (size_t)s2;
  s2_local = s1;
  while( true ) {
    if (c1 == 0) {
      return 0;
    }
    local_40 = (ulong)*s2_local;
    local_48 = (ulong)*(byte *)n_local;
    if (local_40 != local_48) break;
    if (local_40 == 0) {
      return 0;
    }
    c1 = c1 - 1;
    n_local = n_local + 1;
    s2_local = s2_local + 1;
  }
  if ((local_40 != 0) && (local_48 != 0)) {
    if (local_40 == 0x2f) {
      local_40 = 0;
    }
    if (local_48 == 0x2f) {
      local_48 = 0;
    }
    return local_40 - local_48;
  }
  return local_40 - local_48;
}

Assistant:

ngx_int_t
ngx_filename_cmp(u_char *s1, u_char *s2, size_t n)
{
    ngx_uint_t  c1, c2;

    while (n) {
        c1 = (ngx_uint_t) *s1++;
        c2 = (ngx_uint_t) *s2++;

#if (NGX_HAVE_CASELESS_FILESYSTEM)
        c1 = tolower(c1);
        c2 = tolower(c2);
#endif

        if (c1 == c2) {

            if (c1) {
                n--;
                continue;
            }

            return 0;
        }

        /* we need '/' to be the lowest character */

        if (c1 == 0 || c2 == 0) {
            return c1 - c2;
        }

        c1 = (c1 == '/') ? 0 : c1;
        c2 = (c2 == '/') ? 0 : c2;

        return c1 - c2;
    }

    return 0;
}